

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::peekString(XMLReader *this,XMLCh *toPeek)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  bool bVar4;
  XMLSize_t t;
  XMLSize_t charsLeft;
  XMLSize_t srcLen;
  XMLCh *toPeek_local;
  XMLReader *this_local;
  
  XVar2 = XMLString::stringLen(toPeek);
  t = charsLeftInBuffer(this);
  do {
    if (XVar2 <= t) {
      iVar1 = memcmp(this->fCharBuf + this->fCharIndex,toPeek,XVar2 << 1);
      if (iVar1 != 0) {
        return false;
      }
      return true;
    }
    refreshCharBuffer(this);
    XVar3 = charsLeftInBuffer(this);
    bVar4 = XVar3 != t;
    t = XVar3;
  } while (bVar4);
  return false;
}

Assistant:

bool XMLReader::peekString(const XMLCh* const toPeek)
{
    // Get the length of the string to skip
    const XMLSize_t srcLen = XMLString::stringLen(toPeek);

    //
    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    XMLSize_t charsLeft = charsLeftInBuffer();
    while (charsLeft < srcLen)
    {
         refreshCharBuffer();
         XMLSize_t t = charsLeftInBuffer();
         if (t == charsLeft)   // if the refreshCharBuf() did not add anything new
             return false;     //   give up and return.
         charsLeft = t;
	}




    //
    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toPeek, srcLen*sizeof(XMLCh)))
        return false;

    return true;
}